

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O2

int N_VLinearCombinationVectorArray_Serial(int nvec,int nsum,realtype *c,N_Vector **X,N_Vector *Z)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  N_Vector *pp_Var7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  
  if (nsum < 1 || nvec < 1) {
    return -1;
  }
  uVar6 = (ulong)(uint)nsum;
  uVar8 = (ulong)(uint)nvec;
  if (nvec == 1) {
    if (nsum == 2) {
      N_VLinearSum_Serial(*c,**X,c[1],*X[1],*Z);
    }
    else {
      if (nsum != 1) {
        pp_Var7 = (N_Vector *)malloc(uVar6 * 8);
        for (uVar8 = 0; uVar6 != uVar8; uVar8 = uVar8 + 1) {
          pp_Var7[uVar8] = *X[uVar8];
        }
        iVar4 = N_VLinearCombination_Serial(nsum,c,pp_Var7,*Z);
        goto LAB_003c95a5;
      }
      N_VScale_Serial(*c,**X,*Z);
    }
    iVar4 = 0;
  }
  else {
    if (nsum == 2) {
      iVar4 = N_VLinearSumVectorArray_Serial(nvec,*c,*X,c[1],X[1],Z);
      return iVar4;
    }
    if (nsum != 1) {
      uVar1 = *(*Z)->content;
      pp_Var7 = *X;
      if (pp_Var7 != Z) {
        uVar9 = (ulong)uVar1;
        if ((int)uVar1 < 1) {
          uVar9 = 0;
        }
        for (uVar10 = 0; uVar10 != uVar8; uVar10 = uVar10 + 1) {
          lVar2 = *(long *)((long)pp_Var7[uVar10]->content + 8);
          lVar3 = *(long *)((long)Z[uVar10]->content + 8);
          for (uVar12 = 0; uVar11 = 1, uVar9 != uVar12; uVar12 = uVar12 + 1) {
            *(double *)(lVar3 + uVar12 * 8) = *c * *(double *)(lVar2 + uVar12 * 8);
          }
          for (; uVar11 != uVar6; uVar11 = uVar11 + 1) {
            lVar2 = *(long *)((long)X[uVar11][uVar10]->content + 8);
            for (uVar12 = 0; uVar9 != uVar12; uVar12 = uVar12 + 1) {
              *(double *)(lVar3 + uVar12 * 8) =
                   c[uVar11] * *(double *)(lVar2 + uVar12 * 8) + *(double *)(lVar3 + uVar12 * 8);
            }
          }
        }
        return 0;
      }
      uVar5 = 0;
      if (0 < (int)uVar1) {
        uVar5 = uVar1;
      }
      if ((*c == 1.0) && (!NAN(*c))) {
        for (uVar9 = 0; uVar9 != uVar8; uVar9 = uVar9 + 1) {
          lVar2 = *(long *)((long)Z[uVar9]->content + 8);
          for (uVar10 = 1; uVar10 != uVar6; uVar10 = uVar10 + 1) {
            lVar3 = *(long *)((long)X[uVar10][uVar9]->content + 8);
            for (uVar12 = 0; uVar5 != uVar12; uVar12 = uVar12 + 1) {
              *(double *)(lVar2 + uVar12 * 8) =
                   c[uVar10] * *(double *)(lVar3 + uVar12 * 8) + *(double *)(lVar2 + uVar12 * 8);
            }
          }
        }
        return 0;
      }
      for (uVar9 = 0; uVar9 != uVar8; uVar9 = uVar9 + 1) {
        lVar2 = *(long *)((long)Z[uVar9]->content + 8);
        for (uVar10 = 0; uVar12 = 1, uVar5 != uVar10; uVar10 = uVar10 + 1) {
          *(double *)(lVar2 + uVar10 * 8) = *c * *(double *)(lVar2 + uVar10 * 8);
        }
        for (; uVar12 != uVar6; uVar12 = uVar12 + 1) {
          lVar3 = *(long *)((long)X[uVar12][uVar9]->content + 8);
          for (uVar10 = 0; uVar5 != uVar10; uVar10 = uVar10 + 1) {
            *(double *)(lVar2 + uVar10 * 8) =
                 c[uVar12] * *(double *)(lVar3 + uVar10 * 8) + *(double *)(lVar2 + uVar10 * 8);
          }
        }
      }
      return 0;
    }
    pp_Var7 = (N_Vector *)malloc(uVar8 * 8);
    for (uVar6 = 0; uVar8 != uVar6; uVar6 = uVar6 + 1) {
      pp_Var7[uVar6] = (N_Vector)*c;
    }
    iVar4 = N_VScaleVectorArray_Serial(nvec,(realtype *)pp_Var7,*X,Z);
LAB_003c95a5:
    free(pp_Var7);
  }
  return iVar4;
}

Assistant:

int N_VLinearCombinationVectorArray_Serial(int nvec, int nsum, realtype* c,
                                           N_Vector** X, N_Vector* Z)
{
  int          i; /* vector arrays index in summation [0,nsum) */
  int          j; /* vector index in vector array     [0,nvec) */
  sunindextype k; /* element index in vector          [0,N)    */
  sunindextype N;
  realtype*    zd=NULL;
  realtype*    xd=NULL;

  int          retval;
  realtype*    ctmp;
  N_Vector*   Y;

  /* invalid number of vectors */
  if (nvec < 1) return(-1);
  if (nsum < 1) return(-1);

  /* ---------------------------
   * Special cases for nvec == 1
   * --------------------------- */

  if (nvec == 1) {

    /* should have called N_VScale */
    if (nsum == 1) {
      N_VScale_Serial(c[0], X[0][0], Z[0]);
      return(0);
    }

    /* should have called N_VLinearSum */
    if (nsum == 2) {
      N_VLinearSum_Serial(c[0], X[0][0], c[1], X[1][0], Z[0]);
      return(0);
    }

    /* should have called N_VLinearCombination */
    Y = (N_Vector*) malloc(nsum * sizeof(N_Vector));

    for (i=0; i<nsum; i++) {
      Y[i] = X[i][0];
    }

    retval = N_VLinearCombination_Serial(nsum, c, Y, Z[0]);

    free(Y);
    return(retval);
  }

  /* --------------------------
   * Special cases for nvec > 1
   * -------------------------- */

  /* should have called N_VScaleVectorArray */
  if (nsum == 1) {

    ctmp = (realtype*) malloc(nvec * sizeof(realtype));

    for (j=0; j<nvec; j++) {
      ctmp[j] = c[0];
    }

    retval = N_VScaleVectorArray_Serial(nvec, ctmp, X[0], Z);

    free(ctmp);
    return(retval);
  }

  /* should have called N_VLinearSumVectorArray */
  if (nsum == 2) {
    retval = N_VLinearSumVectorArray_Serial(nvec, c[0], X[0], c[1], X[1], Z);
    return(retval);
  }

  /* --------------------------
   * Compute linear combination
   * -------------------------- */

  /* get vector length */
  N = NV_LENGTH_S(Z[0]);

  /*
   * X[0][j] += c[i]*X[i][j], i = 1,...,nvec-1
   */
  if ((X[0] == Z) && (c[0] == ONE)) {
    for (j=0; j<nvec; j++) {
      zd = NV_DATA_S(Z[j]);
      for (i=1; i<nsum; i++) {
        xd = NV_DATA_S(X[i][j]);
        for (k=0; k<N; k++) {
          zd[k] += c[i] * xd[k];
        }
      }
    }
    return(0);
  }

  /*
   * X[0][j] = c[0] * X[0][j] + sum{ c[i] * X[i][j] }, i = 1,...,nvec-1
   */
  if (X[0] == Z) {
    for (j=0; j<nvec; j++) {
      zd = NV_DATA_S(Z[j]);
      for (k=0; k<N; k++) {
        zd[k] *= c[0];
      }
      for (i=1; i<nsum; i++) {
        xd = NV_DATA_S(X[i][j]);
        for (k=0; k<N; k++) {
          zd[k] += c[i] * xd[k];
        }
      }
    }
    return(0);
  }

  /*
   * Z[j] = sum{ c[i] * X[i][j] }, i = 0,...,nvec-1
   */
  for (j=0; j<nvec; j++) {
    xd = NV_DATA_S(X[0][j]);
    zd = NV_DATA_S(Z[j]);
    for (k=0; k<N; k++) {
      zd[k] = c[0] * xd[k];
    }
    for (i=1; i<nsum; i++) {
      xd = NV_DATA_S(X[i][j]);
      for (k=0; k<N; k++) {
        zd[k] += c[i] * xd[k];
      }
    }
  }
  return(0);
}